

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6cb367::TplModelTest_ExponentialEntropyBoundaryTest1_Test::TestBody
          (TplModelTest_ExponentialEntropyBoundaryTest1_Test *this)

{
  bool bVar1;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  double entropy;
  double q_step;
  double b;
  double in_stack_00000160;
  double in_stack_00000168;
  double in_stack_00000170;
  char *in_stack_00000178;
  char *in_stack_00000180;
  char *in_stack_00000188;
  AssertionResult *this_00;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  
  av1_exponential_entropy
            ((double)in_stack_ffffffffffffffc0,
             (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  this_00 = (AssertionResult *)&stack0xffffffffffffffd0;
  testing::internal::DoubleNearPredFormat
            (in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
             in_stack_00000168,in_stack_00000160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x68cfa5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
    testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x68cff1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x68d031);
  return;
}

Assistant:

TEST(TplModelTest, ExponentialEntropyBoundaryTest1) {
  double b = 0;
  double q_step = 1;
  double entropy = av1_exponential_entropy(q_step, b);
  EXPECT_NEAR(entropy, 0, 0.00001);
}